

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O3

path * ghc::filesystem::proximate(path *__return_storage_ptr__,path *p,path *base,error_code *ec)

{
  path local_68;
  path local_48;
  
  weakly_canonical(&local_48,p,ec);
  weakly_canonical(&local_68,base,ec);
  path::lexically_proximate(__return_storage_ptr__,&local_48,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._path._M_dataplus._M_p != &local_68._path.field_2) {
    operator_delete(local_68._path._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._path._M_dataplus._M_p != &local_48._path.field_2) {
    operator_delete(local_48._path._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path proximate(const path& p, const path& base, std::error_code& ec)
{
    return weakly_canonical(p, ec).lexically_proximate(weakly_canonical(base, ec));
}